

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonQuoteFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  long lVar1;
  JsonString *in_RDX;
  sqlite3_context *in_RDI;
  long in_FS_OFFSET;
  JsonString jx;
  sqlite3_context *ctx_00;
  JsonParse *pParse;
  sqlite3_value *pValue;
  JsonString *p;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ctx_00 = (sqlite3_context *)&DAT_aaaaaaaaaaaaaaaa;
  pValue = (sqlite3_value *)&DAT_aaaaaaaaaaaaaaaa;
  p = (JsonString *)&DAT_aaaaaaaaaaaaaaaa;
  pParse = (JsonParse *)&stack0xffffffffffffff68;
  jsonStringInit((JsonString *)&DAT_aaaaaaaaaaaaaaaa,(sqlite3_context *)&DAT_aaaaaaaaaaaaaaaa);
  jsonAppendSqlValue(p,pValue);
  jsonReturnString(in_RDX,pParse,ctx_00);
  sqlite3_result_subtype(in_RDI,0x4a);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void jsonQuoteFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonString jx;
  UNUSED_PARAMETER(argc);

  jsonStringInit(&jx, ctx);
  jsonAppendSqlValue(&jx, argv[0]);
  jsonReturnString(&jx, 0, 0);
  sqlite3_result_subtype(ctx, JSON_SUBTYPE);
}